

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_a31d20::MemPoolAccept::PolicyScriptChecks
          (MemPoolAccept *this,ATMPArgs *args,Workspace *ws)

{
  long lVar1;
  bool bVar2;
  MemPoolAccept *pMVar3;
  MemPoolAccept *this_00;
  ValidationCache *this_01;
  long in_RDX;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  uint scriptVerifyFlags;
  TxValidationState *state;
  CTransaction *tx;
  TxValidationState state_dummy;
  PrecomputedTransactionData *in_stack_000001d0;
  ValidationCache *in_stack_000001d8;
  vector<CScriptCheck,_std::allocator<CScriptCheck>_> *in_stack_000001e0;
  MemPoolAccept *in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  __shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffe88;
  string *reject_reason;
  TxValidationResult in_stack_fffffffffffffe94;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  undefined2 uVar4;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  byte bVar5;
  TxValidationState *in_stack_ffffffffffffff70;
  CTransaction *in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffffb4;
  
  uVar4 = (undefined2)((ulong)in_RDI >> 0x30);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
             (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
             (AnnotatedMixin<std::recursive_mutex> *)0x7f86df);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
             (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
             (AnnotatedMixin<std::recursive_mutex> *)0x7f8706);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            (in_stack_fffffffffffffe88);
  pMVar3 = (MemPoolAccept *)(in_RDX + 0x118);
  GetValidationCache(in_stack_fffffffffffffe78);
  bVar2 = CheckInputScripts(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                            (CCoinsViewCache *)
                            CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                            in_stack_ffffffffffffffb4,SUB21((ushort)uVar4 >> 8,0),SUB21(uVar4,0),
                            in_stack_000001d0,in_stack_000001d8,in_stack_000001e0);
  if (bVar2) {
    bVar5 = 1;
  }
  else {
    TxValidationState::TxValidationState((TxValidationState *)pMVar3);
    bVar2 = CTransaction::HasWitness((CTransaction *)pMVar3);
    this_00 = pMVar3;
    if (!bVar2) {
      this_00 = (MemPoolAccept *)(in_RDX + 0x118);
      GetValidationCache(pMVar3);
      bVar2 = CheckInputScripts(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                (CCoinsViewCache *)
                                CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                                in_stack_ffffffffffffffb4,SUB21((ushort)uVar4 >> 8,0),SUB21(uVar4,0)
                                ,in_stack_000001d0,in_stack_000001d8,in_stack_000001e0);
      if (bVar2) {
        pMVar3 = (MemPoolAccept *)(in_RDX + 0x118);
        this_01 = GetValidationCache(this_00);
        reject_reason = (string *)0x0;
        bVar2 = CheckInputScripts(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                  (CCoinsViewCache *)
                                  CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                                  in_stack_ffffffffffffffb4,SUB21((ushort)uVar4 >> 8,0),
                                  SUB21(uVar4,0),in_stack_000001d0,in_stack_000001d8,
                                  in_stack_000001e0);
        this_00 = pMVar3;
        if (!bVar2) {
          ValidationState<TxValidationResult>::GetRejectReason_abi_cxx11_
                    ((ValidationState<TxValidationResult> *)this_01);
          ValidationState<TxValidationResult>::GetDebugMessage_abi_cxx11_
                    ((ValidationState<TxValidationResult> *)this_01);
          ValidationState<TxValidationResult>::Invalid
                    ((ValidationState<TxValidationResult> *)
                     CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                     in_stack_fffffffffffffe94,reject_reason,(string *)this_01);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pMVar3);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pMVar3);
          this_00 = pMVar3;
        }
      }
    }
    bVar5 = 0;
    TxValidationState::~TxValidationState((TxValidationState *)this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool MemPoolAccept::PolicyScriptChecks(const ATMPArgs& args, Workspace& ws)
{
    AssertLockHeld(cs_main);
    AssertLockHeld(m_pool.cs);
    const CTransaction& tx = *ws.m_ptx;
    TxValidationState& state = ws.m_state;

    constexpr unsigned int scriptVerifyFlags = STANDARD_SCRIPT_VERIFY_FLAGS;

    // Check input scripts and signatures.
    // This is done last to help prevent CPU exhaustion denial-of-service attacks.
    if (!CheckInputScripts(tx, state, m_view, scriptVerifyFlags, true, false, ws.m_precomputed_txdata, GetValidationCache())) {
        // SCRIPT_VERIFY_CLEANSTACK requires SCRIPT_VERIFY_WITNESS, so we
        // need to turn both off, and compare against just turning off CLEANSTACK
        // to see if the failure is specifically due to witness validation.
        TxValidationState state_dummy; // Want reported failures to be from first CheckInputScripts
        if (!tx.HasWitness() && CheckInputScripts(tx, state_dummy, m_view, scriptVerifyFlags & ~(SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_CLEANSTACK), true, false, ws.m_precomputed_txdata, GetValidationCache()) &&
                !CheckInputScripts(tx, state_dummy, m_view, scriptVerifyFlags & ~SCRIPT_VERIFY_CLEANSTACK, true, false, ws.m_precomputed_txdata, GetValidationCache())) {
            // Only the witness is missing, so the transaction itself may be fine.
            state.Invalid(TxValidationResult::TX_WITNESS_STRIPPED,
                    state.GetRejectReason(), state.GetDebugMessage());
        }
        return false; // state filled in by CheckInputScripts
    }

    return true;
}